

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance
          (KDTree<phosg::Vector2<long>,_long> *this,Iterator *it)

{
  bool bVar1;
  reference ppNVar2;
  pair<phosg::Vector2<long>,_long> local_68;
  value_type local_50;
  Node *n_1;
  value_type local_30;
  Node *n;
  Node *pNStack_20;
  bool deleted;
  Node *to_delete;
  Iterator *it_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  to_delete = (Node *)it;
  it_local = (Iterator *)this;
  ppNVar2 = ::std::
            deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ::front(&it->pending);
  pNStack_20 = *ppNVar2;
  n._7_1_ = delete_node(this,pNStack_20);
  if ((bool)n._7_1_) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)to_delete);
    bVar1 = ::std::
            deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ::empty((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                     *)to_delete);
    if (!bVar1) {
      ppNVar2 = ::std::
                deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                         *)to_delete);
      local_30 = *ppNVar2;
      ::std::make_pair<phosg::Vector2<long>&,long&>
                ((pair<phosg::Vector2<long>,_long> *)&n_1,&local_30->pt,&local_30->value);
      ::std::pair<phosg::Vector2<long>,_long>::operator=
                ((pair<phosg::Vector2<long>,_long> *)&to_delete[1].before,(type)&n_1);
    }
  }
  else {
    ppNVar2 = ::std::
              deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)to_delete);
    local_50 = *ppNVar2;
    ::std::make_pair<phosg::Vector2<long>&,long&>(&local_68,&local_50->pt,&local_50->value);
    ::std::pair<phosg::Vector2<long>,_long>::operator=
              ((pair<phosg::Vector2<long>,_long> *)&to_delete[1].before,&local_68);
  }
  return;
}

Assistant:

void KDTree<CoordType, ValueType>::erase_advance(Iterator& it) {
  // delete_node doesn't actually delete the node unless it was a leaf node. if
  // it wasn't a leaf, its value got replaced with a node we haven't seen yet,
  // so just leave the queue alone. if it was a leaf, then it got deleted, so
  // remove the pointer from the queue and update current
  Node* to_delete = it.pending.front();
  bool deleted = this->delete_node(to_delete);
  if (deleted) {
    it.pending.pop_front();
    if (!it.pending.empty()) {
      Node* n = it.pending.front();
      it.current = std::make_pair(n->pt, n->value);
    }
  } else {
    Node* n = it.pending.front();
    it.current = std::make_pair(n->pt, n->value);
  }
}